

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O2

void idct32_high28_stage6_avx2(__m256i *x,int32_t *cospi,__m256i _r,int8_t cos_bit)

{
  __m256i alVar1;
  __m256i alVar2;
  __m256i alVar3;
  __m256i w0;
  __m256i w1;
  __m256i w1_00;
  __m256i w1_01;
  __m256i w1_02;
  __m256i _r_00;
  __m256i _r_01;
  __m256i _r_02;
  __m256i _r_03;
  int32_t cos_bit_00;
  int32_t cos_bit_01;
  int32_t cos_bit_02;
  int32_t cos_bit_03;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  longlong in_register_00001218;
  undefined1 in_stack_00000028 [32];
  undefined1 in_stack_00000048 [32];
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  
  uVar5 = 0x61ff138;
  uVar4 = 0xec8061f;
  alVar1[1] = in_XMM0_Qb;
  alVar1[0] = in_XMM0_Qa;
  alVar1[2] = in_YMM0_H;
  alVar1[3] = in_register_00001218;
  w1[1]._0_4_ = 0x61ff138;
  w1[0] = 0x61ff138061ff138;
  w1[1]._4_4_ = 0x61ff138;
  w1[2]._0_4_ = 0x61ff138;
  w1[2]._4_4_ = 0x61ff138;
  w1[3]._0_4_ = 0x61ff138;
  w1[3]._4_4_ = 0x61ff138;
  _r_00[1]._0_4_ = 0xec8061f;
  _r_00[0] = 0xec8061f0ec8061f;
  _r_00[1]._4_4_ = 0xec8061f;
  _r_00[2]._0_4_ = 0xec8061f;
  _r_00[2]._4_4_ = 0xec8061f;
  _r_00[3]._0_4_ = 0xec8061f;
  _r_00[3]._4_4_ = 0xec8061f;
  uVar6 = uVar5;
  uVar7 = uVar5;
  uVar8 = uVar5;
  uVar9 = uVar5;
  uVar10 = uVar5;
  uVar11 = uVar5;
  uVar12 = uVar5;
  uVar13 = uVar4;
  uVar14 = uVar4;
  uVar15 = uVar4;
  uVar16 = uVar4;
  uVar17 = uVar4;
  uVar18 = uVar4;
  uVar19 = uVar4;
  btf_16_w16_avx2(alVar1,w1,x + 5,x + 6,_r_00,-0xec7061f);
  alVar1 = x[8];
  alVar2 = x[9];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0xb]);
  x[8] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0xb]);
  x[0xb] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar2,(undefined1  [32])x[10]);
  x[9] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar2,(undefined1  [32])x[10]);
  x[10] = alVar1;
  alVar1 = x[0xf];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0xc]);
  x[0xf] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0xc]);
  x[0xc] = alVar1;
  alVar1 = x[0xe];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0xd]);
  x[0xe] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0xd]);
  x[0xd] = alVar1;
  alVar2[1] = in_XMM0_Qb;
  alVar2[0] = in_XMM0_Qa;
  alVar2[2] = in_YMM0_H;
  alVar2[3] = in_register_00001218;
  w1_00[0]._4_4_ = uVar6;
  w1_00[0]._0_4_ = uVar5;
  w1_00[1]._0_4_ = uVar7;
  w1_00[1]._4_4_ = uVar8;
  w1_00[2]._0_4_ = uVar9;
  w1_00[2]._4_4_ = uVar10;
  w1_00[3]._0_4_ = uVar11;
  w1_00[3]._4_4_ = uVar12;
  _r_01[0]._4_4_ = uVar13;
  _r_01[0]._0_4_ = uVar4;
  _r_01[1]._0_4_ = uVar14;
  _r_01[1]._4_4_ = uVar15;
  _r_01[2]._0_4_ = uVar16;
  _r_01[2]._4_4_ = uVar17;
  _r_01[3]._0_4_ = uVar18;
  _r_01[3]._4_4_ = uVar19;
  btf_16_w16_avx2(alVar2,w1_00,x + 0x12,x + 0x1d,_r_01,cos_bit_00);
  alVar3[1] = in_XMM0_Qb;
  alVar3[0] = in_XMM0_Qa;
  alVar3[2] = in_YMM0_H;
  alVar3[3] = in_register_00001218;
  w1_01[0]._4_4_ = uVar6;
  w1_01[0]._0_4_ = uVar5;
  w1_01[1]._0_4_ = uVar7;
  w1_01[1]._4_4_ = uVar8;
  w1_01[2]._0_4_ = uVar9;
  w1_01[2]._4_4_ = uVar10;
  w1_01[3]._0_4_ = uVar11;
  w1_01[3]._4_4_ = uVar12;
  _r_02[0]._4_4_ = uVar13;
  _r_02[0]._0_4_ = uVar4;
  _r_02[1]._0_4_ = uVar14;
  _r_02[1]._4_4_ = uVar15;
  _r_02[2]._0_4_ = uVar16;
  _r_02[2]._4_4_ = uVar17;
  _r_02[3]._0_4_ = uVar18;
  _r_02[3]._4_4_ = uVar19;
  btf_16_w16_avx2(alVar3,w1_01,x + 0x13,x + 0x1c,_r_02,cos_bit_01);
  w0[1] = in_XMM0_Qb;
  w0[0] = in_XMM0_Qa;
  w0[2] = in_YMM0_H;
  w0[3] = in_register_00001218;
  w1_02[0]._4_4_ = uVar6;
  w1_02[0]._0_4_ = uVar5;
  w1_02[1]._0_4_ = uVar7;
  w1_02[1]._4_4_ = uVar8;
  w1_02[2]._0_4_ = uVar9;
  w1_02[2]._4_4_ = uVar10;
  w1_02[3]._0_4_ = uVar11;
  w1_02[3]._4_4_ = uVar12;
  _r_03[0]._4_4_ = uVar13;
  _r_03[0]._0_4_ = uVar4;
  _r_03[1]._0_4_ = uVar14;
  _r_03[1]._4_4_ = uVar15;
  _r_03[2]._0_4_ = uVar16;
  _r_03[2]._4_4_ = uVar17;
  _r_03[3]._0_4_ = uVar18;
  _r_03[3]._4_4_ = uVar19;
  btf_16_w16_avx2(w0,w1_02,x + 0x14,x + 0x1b,_r_03,cos_bit_02);
  btf_16_w16_avx2(_r,(__m256i)in_stack_00000028,x + 0x15,x + 0x1a,(__m256i)in_stack_00000048,
                  cos_bit_03);
  return;
}

Assistant:

static inline void idct32_high28_stage6_avx2(__m256i *x, const int32_t *cospi,
                                             const __m256i _r, int8_t cos_bit) {
  const __m256i cospi_m32_p32 = pair_set_w16_epi16(-cospi[32], cospi[32]);
  const __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  const __m256i cospi_m16_p48 = pair_set_w16_epi16(-cospi[16], cospi[48]);
  const __m256i cospi_p48_p16 = pair_set_w16_epi16(cospi[48], cospi[16]);
  const __m256i cospi_m48_m16 = pair_set_w16_epi16(-cospi[48], -cospi[16]);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[5], &x[6], _r, cos_bit);
  btf_16_adds_subs_avx2(&x[8], &x[11]);
  btf_16_adds_subs_avx2(&x[9], &x[10]);
  btf_16_adds_subs_avx2(&x[15], &x[12]);
  btf_16_adds_subs_avx2(&x[14], &x[13]);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x[18], &x[29], _r, cos_bit);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x[19], &x[28], _r, cos_bit);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x[20], &x[27], _r, cos_bit);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x[21], &x[26], _r, cos_bit);
}